

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O1

int mbedtls_asn1_get_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  uchar *puVar1;
  int iVar2;
  size_t len;
  size_t local_20;
  
  puVar1 = *p;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    iVar2 = -0x60;
  }
  else {
    iVar2 = -0x62;
    if (*puVar1 == '\x02') {
      *p = puVar1 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,&local_20);
    }
  }
  if (iVar2 == 0) {
    iVar2 = mbedtls_mpi_read_binary(X,*p,local_20);
    *p = *p + local_20;
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_mpi(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_mpi *X)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    ret = mbedtls_mpi_read_binary(X, *p, len);

    *p += len;

    return ret;
}